

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::AttributesDecoder::DecodeAttributesDecoderData
          (AttributesDecoder *this,DecoderBuffer *in_buffer)

{
  ushort uVar1;
  uint8_t num_components_00;
  uint8_t uVar2;
  PointCloud *this_00;
  vector<int,_std::allocator<int>_> *pvVar3;
  bool bVar4;
  int32_t iVar5;
  int iVar6;
  PointAttribute *this_01;
  pointer piVar7;
  ulong uVar8;
  Type attribute_type;
  DataType dt;
  uint8_t num_components;
  uint8_t att_type;
  uint8_t normalized;
  uint8_t data_type;
  uint16_t custom_id;
  uint32_t unique_id;
  uint32_t num_attributes;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_98;
  DecoderBuffer *local_90;
  PointCloud *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  ulong local_78;
  GeometryAttribute ga;
  
  if (this->point_cloud_decoder_->version_major_ < 2) {
    bVar4 = DecoderBuffer::Decode<unsigned_int>(in_buffer,&num_attributes);
  }
  else {
    bVar4 = DecodeVarint<unsigned_int>(&num_attributes,in_buffer);
  }
  if (((bVar4 == false) || (uVar8 = (ulong)num_attributes, uVar8 == 0)) ||
     ((in_buffer->data_size_ - in_buffer->pos_) * 5 < (long)uVar8)) {
LAB_0014fc6e:
    bVar4 = false;
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize(&this->point_attribute_ids_,uVar8);
    local_88 = this->point_cloud_;
    local_80 = &this->point_attribute_to_local_id_map_;
    local_90 = in_buffer;
    for (uVar8 = 0; uVar8 < num_attributes; uVar8 = uVar8 + 1) {
      bVar4 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&att_type);
      if (((((!bVar4) ||
            (bVar4 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&data_type), !bVar4)) ||
           ((bVar4 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&num_components), !bVar4 ||
            ((bVar4 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&normalized), uVar2 = data_type
             , !bVar4 || (4 < att_type)))))) ||
          (dt = (DataType)data_type, (byte)(data_type - 0xc) < 0xf5)) || (num_components == '\0'))
      goto LAB_0014fc6e;
      local_78 = uVar8;
      GeometryAttribute::GeometryAttribute(&ga);
      num_components_00 = num_components;
      attribute_type = (Type)att_type;
      bVar4 = normalized != '\0';
      iVar5 = DataTypeLength(dt);
      GeometryAttribute::Init
                (&ga,attribute_type,(DataBuffer *)0x0,num_components_00,(uint)uVar2,bVar4,
                 (long)iVar5 * (ulong)num_components,0);
      in_buffer = local_90;
      uVar1._0_1_ = this->point_cloud_decoder_->version_major_;
      uVar1._1_1_ = this->point_cloud_decoder_->version_minor_;
      if ((ushort)(uVar1 << 8 | uVar1 >> 8) < 0x103) {
        bVar4 = DecoderBuffer::Decode<unsigned_short>(local_90,&custom_id);
        if (!bVar4) goto LAB_0014fc6e;
        unique_id = _custom_id & 0xffff;
      }
      else {
        bVar4 = DecodeVarint<unsigned_int>(&unique_id,local_90);
        if (!bVar4) goto LAB_0014fc6e;
      }
      this_00 = local_88;
      ga.unique_id_ = unique_id;
      this_01 = (PointAttribute *)operator_new(0x70);
      PointAttribute::PointAttribute(this_01,&ga);
      uVar8 = local_78;
      local_98._M_head_impl = this_01;
      iVar6 = PointCloud::AddAttribute
                        (this_00,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                  *)&local_98);
      std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
      ~unique_ptr((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
                  &local_98);
      pvVar3 = local_80;
      *(uint32_t *)
       ((long)(this_00->attributes_).
              super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_t.
              super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
              ._M_t + 0x3c) = unique_id;
      (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = iVar6;
      piVar7 = (this->point_attribute_to_local_id_map_).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((int)((ulong)((long)(this->point_attribute_to_local_id_map_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar7) >> 2) <= iVar6) {
        _custom_id = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::resize
                  (local_80,(long)(iVar6 + 1),(value_type_conflict1 *)&custom_id);
        piVar7 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      piVar7[iVar6] = (int)uVar8;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool AttributesDecoder::DecodeAttributesDecoderData(DecoderBuffer *in_buffer) {
  // Decode and create attributes.
  uint32_t num_attributes;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (point_cloud_decoder_->bitstream_version() <
      DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!in_buffer->Decode(&num_attributes)) {
      return false;
    }
  } else
#endif
  {
    if (!DecodeVarint(&num_attributes, in_buffer)) {
      return false;
    }
  }

  // Check that decoded number of attributes is valid.
  if (num_attributes == 0) {
    return false;
  }
  if (num_attributes > 5 * in_buffer->remaining_size()) {
    // The decoded number of attributes is unreasonably high, because at least
    // five bytes of attribute descriptor data per attribute are expected.
    return false;
  }

  // Decode attribute descriptor data.
  point_attribute_ids_.resize(num_attributes);
  PointCloud *pc = point_cloud_;
  for (uint32_t i = 0; i < num_attributes; ++i) {
    // Decode attribute descriptor data.
    uint8_t att_type, data_type, num_components, normalized;
    if (!in_buffer->Decode(&att_type)) {
      return false;
    }
    if (!in_buffer->Decode(&data_type)) {
      return false;
    }
    if (!in_buffer->Decode(&num_components)) {
      return false;
    }
    if (!in_buffer->Decode(&normalized)) {
      return false;
    }
    if (att_type >= GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
      return false;
    }
    if (data_type == DT_INVALID || data_type >= DT_TYPES_COUNT) {
      return false;
    }

    // Check decoded attribute descriptor data.
    if (num_components == 0) {
      return false;
    }

    // Add the attribute to the point cloud.
    const DataType draco_dt = static_cast<DataType>(data_type);
    GeometryAttribute ga;
    ga.Init(static_cast<GeometryAttribute::Type>(att_type), nullptr,
            num_components, draco_dt, normalized > 0,
            DataTypeLength(draco_dt) * num_components, 0);
    uint32_t unique_id;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (point_cloud_decoder_->bitstream_version() <
        DRACO_BITSTREAM_VERSION(1, 3)) {
      uint16_t custom_id;
      if (!in_buffer->Decode(&custom_id)) {
        return false;
      }
      // TODO(draco-eng): Add "custom_id" to attribute metadata.
      unique_id = static_cast<uint32_t>(custom_id);
      ga.set_unique_id(unique_id);
    } else
#endif
    {
      if (!DecodeVarint(&unique_id, in_buffer)) {
        return false;
      }
      ga.set_unique_id(unique_id);
    }
    const int att_id = pc->AddAttribute(
        std::unique_ptr<PointAttribute>(new PointAttribute(ga)));
    pc->attribute(att_id)->set_unique_id(unique_id);
    point_attribute_ids_[i] = att_id;

    // Update the inverse map.
    if (att_id >=
        static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(att_id + 1, -1);
    }
    point_attribute_to_local_id_map_[att_id] = i;
  }
  return true;
}